

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  Func *offset;
  bool bVar1;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  Location local_40;
  undefined1 local_20 [8];
  unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> metadata;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  offset = this->current_func_;
  metadata._M_t.
  super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
  super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>,_true,_true>
        )(__uniq_ptr_data<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>,_true,_true>
          )this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_40,this);
  CodeMetadataExprQueue::pop_match
            ((CodeMetadataExprQueue *)local_20,(Func *)&this->code_metadata_queue_,(Offset)offset);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
  if (bVar1) {
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,
               (unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
               local_20);
    this_local._4_4_ = AppendExpr(this,&local_48);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::~unique_ptr
            ((unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
             local_20);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  return Result::Ok;
}